

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O0

Trampoline * __thiscall
SequenceMeaning::Eval(Trampoline *__return_storage_ptr__,SequenceMeaning *this,Sexp *act)

{
  bool bVar1;
  reference ppSVar2;
  Sexp **entry;
  iterator __end1;
  iterator __begin1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *__range1;
  FrameProtector __frame_prot;
  ContractFrameProtector local_20;
  ContractFrameProtector __contract_frame;
  Sexp *act_local;
  SequenceMeaning *this_local;
  
  __contract_frame.protected_frame = (ContractFrame *)act;
  ContractFrameProtector::ContractFrameProtector(&local_20,"Eval");
  bVar1 = Sexp::IsActivation((Sexp *)__contract_frame.protected_frame);
  ContractFrameProtector::CheckPrecondition(&local_20,bVar1,"act->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&__range1,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&__range1,(Sexp **)&__contract_frame,"act");
  __end1 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->body);
  entry = (Sexp **)std::vector<Sexp_*,_std::allocator<Sexp_*>_>::end(&this->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
              operator*(&__end1);
    Evaluate(*ppSVar2,(Sexp *)__contract_frame.protected_frame);
    __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::operator++
              (&__end1);
  }
  Trampoline::Trampoline
            (__return_storage_ptr__,(Sexp *)__contract_frame.protected_frame,this->final_form);
  FrameProtector::~FrameProtector((FrameProtector *)&__range1);
  ContractFrameProtector::~ContractFrameProtector(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Trampoline SequenceMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }